

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,tagbstring *x)

{
  uchar *puVar1;
  CBStringException *pCVar2;
  long lVar3;
  CBStringException bstr__cppwrapper_exception;
  CBStringException CStack_98;
  string local_70;
  string local_50;
  string local_30;
  
  if ((this->super_tagbstring).mlen < 1) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"CBString::Write protection error","");
    CBStringException::CBStringException(&CStack_98,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_98);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (-1 < x->slen) {
    alloc(this,x->slen + (this->super_tagbstring).slen + 1);
    puVar1 = (this->super_tagbstring).data;
    if (puVar1 != (uchar *)0x0) {
      memcpy(puVar1 + (this->super_tagbstring).slen,x->data,(long)x->slen);
      lVar3 = (long)(this->super_tagbstring).slen + (long)x->slen;
      (this->super_tagbstring).slen = (int)lVar3;
      (this->super_tagbstring).data[lVar3] = '\0';
      return this;
    }
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CBString::Failure in +=(tagbstring) operator","");
    CBStringException::CBStringException(&CStack_98,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_98);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "CBString::Failure in +=(tagbstring) operator, badly formed tagbstring","");
  CBStringException::CBStringException(&CStack_98,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&CStack_98);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator += (const tagbstring& x) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (x.slen < 0) bstringThrow ("Failure in +=(tagbstring) operator, badly formed tagbstring");
	alloc (x.slen + slen + 1);

	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in +=(tagbstring) operator");
	} else {
		bstr__memcpy (data + slen, x.data, x.slen);
		slen += x.slen;
		data[slen] = '\0';
	}
	return *this;
}